

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

bool __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::CommitBuffer(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
               *this,TEmitBufferAllocation *allocation,size_t destBufferBytes,BYTE *destBuffer,
              size_t bytes,BYTE *sourceBuffer,DWORD alignPad)

{
  char *pcVar1;
  code *pcVar2;
  char *addressInPage;
  bool bVar3;
  DWORD DVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  size_t sVar7;
  JITManager *pJVar8;
  ulong uVar9;
  DWORD local_104;
  BYTE *local_e8;
  DWORD bufferBytesFree;
  DWORD alignBytes;
  size_t readWriteBytes;
  BYTE *readWriteBuffer;
  size_t bytesToChange;
  DWORD spaceInCurrentPage;
  size_t sizeToFlush;
  size_t bytesLeft;
  char *bufferToFlush;
  BYTE *currentDestBuffer;
  AutoRealOrFakeCriticalSection<CriticalSection> local_48;
  AutoRealOrFakeCriticalSection<CriticalSection> autoCs;
  BYTE *sourceBuffer_local;
  size_t bytes_local;
  BYTE *destBuffer_local;
  size_t destBufferBytes_local;
  TEmitBufferAllocation *allocation_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  autoCs.cs = (CriticalSection *)sourceBuffer;
  AutoRealOrFakeCriticalSection<CriticalSection>::AutoRealOrFakeCriticalSection
            (&local_48,&this->criticalSection);
  if (destBuffer == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1cf,"(destBuffer != nullptr)","destBuffer != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (allocation == (TEmitBufferAllocation *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d0,"(allocation != nullptr)","allocation != nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (destBufferBytes != allocation->bytesCommitted) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d4,"(destBufferBytes == allocation->bytesCommitted)",
                       "destBufferBytes == allocation->bytesCommitted");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  if (destBufferBytes < allocation->bytesUsed + bytes + (ulong)alignPad) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1d7,"(allocation->bytesUsed + bytes + alignPad <= destBufferBytes)",
                       "allocation->bytesUsed + bytes + alignPad <= destBufferBytes");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  sVar7 = EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
          ::GetBytesUsed(allocation);
  bufferToFlush = (char *)(destBuffer + sVar7);
  pcVar1 = allocation->allocation->address;
  sVar7 = EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
          ::GetBytesUsed(allocation);
  DVar4 = EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
          ::BytesFree(allocation);
  if ((ulong)DVar4 < bytes + alignPad) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                       ,0x1db,"(allocation->BytesFree() >= bytes + alignPad)",
                       "allocation->BytesFree() >= bytes + alignPad");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  uVar9 = (ulong)alignPad;
  sizeToFlush = bytes + uVar9;
  do {
    addressInPage = bufferToFlush;
    if (sizeToFlush == 0) {
      BVar5 = FlushInstructionCache(this->processHandle,pcVar1 + sVar7,bytes + uVar9);
      if (BVar5 == 0) {
        this_local._7_1_ = false;
      }
      else {
        this->totalBytesCode = this->totalBytesCode + bytes;
        this_local._7_1_ = FinalizeAllocation(this,allocation,destBuffer);
      }
      goto LAB_00517ffb;
    }
    if (bufferToFlush < destBuffer) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e4,"(destBuffer <= currentDestBuffer)",
                         "destBuffer <= currentDestBuffer");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if (destBuffer + destBufferBytes <= bufferToFlush) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x1e5,"(currentDestBuffer < destBuffer + destBufferBytes)",
                         "currentDestBuffer < destBuffer + destBufferBytes");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    local_104 = 0x1000 - ((uint)bufferToFlush & 0xfff);
    if (local_104 < sizeToFlush) {
      local_e8 = (BYTE *)(ulong)local_104;
    }
    else {
      local_e8 = (BYTE *)sizeToFlush;
    }
    readWriteBuffer = local_e8;
    bVar3 = CheckCommitFaultInjection(this);
    if (bVar3) {
      this_local._7_1_ = false;
      goto LAB_00517ffb;
    }
    pJVar8 = JITManager::GetJITManager();
    bVar3 = JITManager::IsJITServer(pJVar8);
    if ((!bVar3) &&
       (BVar5 = Memory::CustomHeap::
                Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
                ProtectAllocationWithExecuteReadWrite
                          (&this->allocationHeap,allocation->allocation,bufferToFlush), BVar5 == 0))
    {
      this_local._7_1_ = false;
      goto LAB_00517ffb;
    }
    if (alignPad != 0) {
      if (alignPad < local_104) {
        local_104 = alignPad;
      }
      Memory::CustomHeap::FillDebugBreak((BYTE *)bufferToFlush,(ulong)local_104);
      alignPad = alignPad - local_104;
      bufferToFlush = bufferToFlush + local_104;
      allocation->bytesUsed = (ulong)local_104 + allocation->bytesUsed;
      sizeToFlush = sizeToFlush - local_104;
      readWriteBuffer = local_e8 + -(ulong)local_104;
      this->totalBytesAlignment = (ulong)local_104 + this->totalBytesAlignment;
    }
    if (readWriteBuffer != (BYTE *)0x0) {
      if (alignPad != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x20e,"(alignPad == 0)",
                           "If we are copying right now - we should be done with setting alignment."
                          );
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      DVar4 = EmitBufferAllocation<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>
              ::BytesFree(allocation);
      if (destBuffer + destBufferBytes < bufferToFlush + DVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                           ,0x213,
                           "(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes)",
                           "currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      memcpy_s(bufferToFlush,(ulong)DVar4,autoCs.cs,(size_t)readWriteBuffer);
      bufferToFlush = (char *)(readWriteBuffer + (long)bufferToFlush);
      autoCs.cs = (CriticalSection *)(readWriteBuffer + (long)autoCs.cs);
      allocation->bytesUsed = (size_t)(readWriteBuffer + allocation->bytesUsed);
      sizeToFlush = sizeToFlush - (long)readWriteBuffer;
    }
    if (addressInPage + (long)local_e8 != bufferToFlush) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/EmitBuffer.cpp"
                         ,0x21c,"(readWriteBuffer + readWriteBytes == currentDestBuffer)",
                         "readWriteBuffer + readWriteBytes == currentDestBuffer");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    pJVar8 = JITManager::GetJITManager();
    bVar3 = JITManager::IsJITServer(pJVar8);
  } while ((bVar3) ||
          (BVar5 = Memory::CustomHeap::
                   Heap<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper>::
                   ProtectAllocationWithExecuteReadOnly
                             (&this->allocationHeap,allocation->allocation,addressInPage),
          BVar5 != 0));
  this_local._7_1_ = false;
LAB_00517ffb:
  AutoRealOrFakeCriticalSection<CriticalSection>::~AutoRealOrFakeCriticalSection(&local_48);
  return this_local._7_1_;
}

Assistant:

bool
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::CommitBuffer(TEmitBufferAllocation* allocation, __in const size_t destBufferBytes, __out_bcount(destBufferBytes) BYTE* destBuffer, __in size_t bytes, __in_bcount(bytes) const BYTE* sourceBuffer, __in DWORD alignPad)
{
    AutoRealOrFakeCriticalSection<SyncObject> autoCs(&this->criticalSection);

    Assert(destBuffer != nullptr);
    Assert(allocation != nullptr);

    // The size of destBuffer is actually given by allocation->bytesCommitted, but due to a bug in some versions of PREFast, we can't refer to allocation->bytesCommitted in the
    // SAL annotation on destBuffer above.  We've informed the PREFast maintainers, but we'll have to use destBufferBytes as a workaround until their fix makes it to Jenkins.
    Assert(destBufferBytes == allocation->bytesCommitted);
    
    // Must have at least enough room in destBuffer for the initial skipped bytes plus the bytes we're going to write.
    AnalysisAssert(allocation->bytesUsed + bytes + alignPad <= destBufferBytes);

    BYTE *currentDestBuffer = destBuffer + allocation->GetBytesUsed();
    char *bufferToFlush = allocation->allocation->address + allocation->GetBytesUsed();
    Assert(allocation->BytesFree() >= bytes + alignPad);

    size_t bytesLeft = bytes + alignPad;
    size_t sizeToFlush = bytesLeft;

    // Copy the contents and set the alignment pad
    while(bytesLeft != 0)
    {
        // currentDestBuffer must still point to somewhere in the interior of destBuffer.
        AnalysisAssert(destBuffer <= currentDestBuffer);
        AnalysisAssert(currentDestBuffer < destBuffer + destBufferBytes);

        DWORD spaceInCurrentPage = AutoSystemInfo::PageSize - ((size_t)currentDestBuffer & (AutoSystemInfo::PageSize - 1));
        size_t bytesToChange = bytesLeft > spaceInCurrentPage ? spaceInCurrentPage : bytesLeft;


        // Buffer and the bytes that are marked RWX - these will eventually be marked as 'EXCEUTE' only.
        BYTE* readWriteBuffer = currentDestBuffer;
        size_t readWriteBytes = bytesToChange;

#ifdef ENABLE_DEBUG_CONFIG_OPTIONS
        if (CheckCommitFaultInjection())
        {
            return false;
        }
#endif
        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadWrite(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }

        // Pad with debug-breakpoint instructions up to alignBytes or the end of the current page, whichever is less.
        if (alignPad != 0)
        {
            DWORD alignBytes = alignPad < spaceInCurrentPage ? alignPad : spaceInCurrentPage;
            CustomHeap::FillDebugBreak(currentDestBuffer, alignBytes);

            alignPad -= alignBytes;
            currentDestBuffer += alignBytes;
            allocation->bytesUsed += alignBytes;
            bytesLeft -= alignBytes;
            bytesToChange -= alignBytes;

#if DBG_DUMP
            this->totalBytesAlignment += alignBytes;
#endif
        }

        // If there are bytes still left to be copied then we should do the copy, but only through the end of the current page.
        if(bytesToChange > 0)
        {
            AssertMsg(alignPad == 0, "If we are copying right now - we should be done with setting alignment.");

            const DWORD bufferBytesFree(allocation->BytesFree());
            // Use <= here instead of < to allow this memcopy to fill up the rest of destBuffer.  If we do, then FinalizeAllocation,
            // called below, determines that no additional padding is necessary based on the values in `allocation'.
            AnalysisAssert(currentDestBuffer + bufferBytesFree <= destBuffer + destBufferBytes);
            memcpy_s(currentDestBuffer, bufferBytesFree, sourceBuffer, bytesToChange);

            currentDestBuffer += bytesToChange;
            sourceBuffer += bytesToChange;
            allocation->bytesUsed += bytesToChange;
            bytesLeft -= bytesToChange;
        }

        Assert(readWriteBuffer + readWriteBytes == currentDestBuffer);

        if (!JITManager::GetJITManager()->IsJITServer() && !this->allocationHeap.ProtectAllocationWithExecuteReadOnly(allocation->allocation, (char*)readWriteBuffer))
        {
            return false;
        }
    }

    if (!FlushInstructionCache(this->processHandle, bufferToFlush, sizeToFlush))
    {
        return false;
    }

#if DBG_DUMP
    this->totalBytesCode += bytes;
#endif

    //Finish the current EmitBufferAllocation by filling out the rest of destBuffer with debug breakpoint instructions.
    return FinalizeAllocation(allocation, destBuffer);
}